

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_avx2.c
# Opt level: O0

void sse_w8x2_avx2(uint8_t *a,int a_stride,uint8_t *b,int b_stride,__m256i *sum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  void *in_RDI;
  undefined1 (*in_R8) [32];
  undefined8 in_XMM0_Qa;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 in_XMM0_Qb;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  __m256i v_d_w;
  __m256i v_b_w;
  __m256i v_a_w;
  __m128i v_b1;
  __m128i v_b0;
  __m128i v_a1;
  __m128i v_a0;
  
  xx_loadl_64(in_RDI);
  uVar7 = in_XMM0_Qa;
  uVar10 = in_XMM0_Qb;
  xx_loadl_64((void *)((long)in_RDI + (long)in_ESI));
  uVar8 = uVar7;
  uVar11 = uVar10;
  xx_loadl_64(in_RDX);
  uVar9 = uVar8;
  uVar12 = uVar11;
  xx_loadl_64((void *)((long)in_RDX + (long)in_ECX));
  auVar6._8_8_ = in_XMM0_Qb;
  auVar6._0_8_ = in_XMM0_Qa;
  auVar5._8_8_ = uVar10;
  auVar5._0_8_ = uVar7;
  auVar1 = vpunpcklqdq_avx(auVar6,auVar5);
  auVar2 = vpmovzxbw_avx2(auVar1);
  auVar4._8_8_ = uVar11;
  auVar4._0_8_ = uVar8;
  auVar1._8_8_ = uVar12;
  auVar1._0_8_ = uVar9;
  auVar1 = vpunpcklqdq_avx(auVar4,auVar1);
  auVar3 = vpmovzxbw_avx2(auVar1);
  auVar2 = vpsubw_avx2(auVar2,auVar3);
  auVar2 = vpmaddwd_avx2(auVar2,auVar2);
  auVar2 = vpaddd_avx2(*in_R8,auVar2);
  *in_R8 = auVar2;
  return;
}

Assistant:

static inline void sse_w8x2_avx2(const uint8_t *a, int a_stride,
                                 const uint8_t *b, int b_stride, __m256i *sum) {
  const __m128i v_a0 = xx_loadl_64(a);
  const __m128i v_a1 = xx_loadl_64(a + a_stride);
  const __m128i v_b0 = xx_loadl_64(b);
  const __m128i v_b1 = xx_loadl_64(b + b_stride);
  const __m256i v_a_w = _mm256_cvtepu8_epi16(_mm_unpacklo_epi64(v_a0, v_a1));
  const __m256i v_b_w = _mm256_cvtepu8_epi16(_mm_unpacklo_epi64(v_b0, v_b1));
  const __m256i v_d_w = _mm256_sub_epi16(v_a_w, v_b_w);
  *sum = _mm256_add_epi32(*sum, _mm256_madd_epi16(v_d_w, v_d_w));
}